

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

void __thiscall
Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *fadexpr)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Fad<double> *this_00;
  value_type local_50;
  
  FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::val((value_type *)(this + 8),&fadexpr->fadexpr_)
  ;
  iVar2 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  lVar7 = (long)iVar2;
  *(undefined4 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  if (0 < lVar7) {
    *(int *)(this + 0x28) = iVar2;
    plVar4 = (long *)operator_new__(lVar7 * 0x20 + 8);
    *plVar4 = lVar7;
    lVar5 = 0;
    this_00 = (Fad<double> *)(plVar4 + 1);
    do {
      Fad<double>::Fad(this_00);
      lVar5 = lVar5 + -0x20;
      this_00 = this_00 + 1;
    } while (-lVar5 != lVar7 * 0x20);
    *(Fad<double> **)(this + 0x30) = (Fad<double> *)(plVar4 + 1);
  }
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined4 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  lVar7 = (long)(((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if (0 < lVar7) {
    lVar5 = 0x18;
    lVar6 = 0;
    do {
      FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::dx(&local_50,&fadexpr->fadexpr_,(int)lVar6);
      lVar3 = *(long *)(this + 0x30);
      lVar1 = lVar3 + lVar5;
      *(double *)(lVar1 + -0x18) = local_50.val_;
      Vector<double>::operator=((Vector<double> *)(lVar1 + -0x10),&local_50.dx_);
      *(double *)(lVar3 + lVar5) = local_50.defaultVal;
      Fad<double>::~Fad(&local_50);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar7 != lVar6);
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }